

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSimBase.c
# Opt level: O3

void Gia_ObjSimCollect(Gia_SimRsbMan_t *p)

{
  int iVar1;
  int Entry;
  Gia_Obj_t *pGVar2;
  int *piVar3;
  Gia_Man_t *pGVar4;
  ulong uVar5;
  Vec_Int_t *pVVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  
  p->vFanins2->nSize = 0;
  pVVar6 = p->vFanins;
  if (pVVar6->nSize < 1) {
    __assert_fail("Vec_IntSize(p->vFanins) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSimBase.c"
                  ,0x27e,"void Gia_ObjSimCollect(Gia_SimRsbMan_t *)");
  }
  pGVar4 = p->pGia;
  lVar12 = 0;
  do {
    iVar1 = pVVar6->pArray[lVar12];
    lVar11 = (long)iVar1;
    if ((lVar11 < 0) || (pGVar4->nObjs <= iVar1)) {
LAB_007d42e3:
      __assert_fail("v >= 0 && v < p->nObjs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                    ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
    }
    pGVar2 = pGVar4->pObjs;
    uVar5 = *(ulong *)(pGVar2 + lVar11);
    uVar7 = (uint)(uVar5 & 0x1fffffff);
    if ((uVar5 & 0x1fffffff) != 0x1fffffff && -1 < (int)(uint)uVar5) {
      iVar8 = iVar1 - ((uint)uVar5 & 0x1fffffff);
      if (pGVar4->nTravIdsAlloc <= iVar8) goto LAB_007d4302;
      if (pGVar4->pTravIds[iVar8] != pGVar4->nTravIds) {
        Vec_IntPush(p->vFanins2,iVar8);
        uVar5 = *(ulong *)(pGVar2 + lVar11);
        pGVar4 = p->pGia;
        uVar7 = (uint)uVar5 & 0x1fffffff;
      }
    }
    if (uVar7 != 0x1fffffff && -1 < (int)uVar5) {
      iVar8 = iVar1 - ((uint)(uVar5 >> 0x20) & 0x1fffffff);
      if (pGVar4->nTravIdsAlloc <= iVar8) {
LAB_007d4302:
        __assert_fail("Id < p->nTravIdsAlloc",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x268,"int Gia_ObjIsTravIdCurrentId(Gia_Man_t *, int)");
      }
      if (pGVar4->pTravIds[iVar8] != pGVar4->nTravIds) {
        Vec_IntPush(p->vFanins2,iVar8);
        pGVar4 = p->pGia;
      }
    }
    pVVar6 = pGVar4->vFanoutNums;
    if (pVVar6->nSize <= iVar1) {
LAB_007d42c4:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    iVar8 = 0;
    while (iVar8 < pVVar6->pArray[lVar11]) {
      uVar7 = pGVar4->vFanout->nSize;
      if ((int)uVar7 <= iVar1) goto LAB_007d42c4;
      piVar3 = pGVar4->vFanout->pArray;
      uVar9 = piVar3[lVar11] + iVar8;
      if (((int)uVar9 < 0) || (uVar7 <= uVar9)) goto LAB_007d42c4;
      Entry = piVar3[uVar9];
      lVar10 = (long)Entry;
      if ((lVar10 < 0) || (pGVar4->nObjs <= Entry)) goto LAB_007d42e3;
      if ((~*(uint *)(pGVar4->pObjs + lVar10) & 0x1fffffff) != 0 &&
          -1 < (int)*(uint *)(pGVar4->pObjs + lVar10)) {
        if (pGVar4->nTravIdsAlloc <= Entry) goto LAB_007d4302;
        if (pGVar4->pTravIds[lVar10] != pGVar4->nTravIds) {
          Vec_IntPush(p->vFanins2,Entry);
          pGVar4 = p->pGia;
        }
      }
      iVar8 = iVar8 + 1;
      pVVar6 = pGVar4->vFanoutNums;
      if (pVVar6->nSize <= iVar1) goto LAB_007d42c4;
    }
    lVar12 = lVar12 + 1;
    pVVar6 = p->vFanins;
    if (pVVar6->nSize <= lVar12) {
      return;
    }
  } while( true );
}

Assistant:

void Gia_ObjSimCollect( Gia_SimRsbMan_t * p )
{
    int i, k, iTemp, iFanout;
    Vec_IntClear( p->vFanins2 );
    assert( Vec_IntSize(p->vFanins) > 0 );
    Vec_IntForEachEntry( p->vFanins, iTemp, i )
    {
        Gia_Obj_t * pObj = Gia_ManObj( p->pGia, iTemp );
        if ( Gia_ObjIsAnd(pObj) && !Gia_ObjIsTravIdCurrentId( p->pGia, Gia_ObjFaninId0(pObj, iTemp) ) )
            Vec_IntPush( p->vFanins2, Gia_ObjFaninId0(pObj, iTemp) );
        if ( Gia_ObjIsAnd(pObj) && !Gia_ObjIsTravIdCurrentId( p->pGia, Gia_ObjFaninId1(pObj, iTemp) ) )
            Vec_IntPush( p->vFanins2, Gia_ObjFaninId1(pObj, iTemp) );
        Gia_ObjForEachFanoutStaticId( p->pGia, iTemp, iFanout, k )
            if ( Gia_ObjIsAnd(Gia_ManObj(p->pGia, iFanout)) && !Gia_ObjIsTravIdCurrentId( p->pGia, iFanout ) )
                Vec_IntPush( p->vFanins2, iFanout );
    }
}